

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O3

void __thiscall
ktx::CommandCompare::compareImagesRaw(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  ktx_uint32_t kVar1;
  pointer pKVar2;
  _Alloc_hider _Var3;
  uint uVar4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  pointer pcVar8;
  void *pvVar9;
  string *psVar10;
  uint uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  pointer pcVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar14;
  long lVar15;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> buffers [2];
  ktxLevelIndexEntry entry;
  optional<ktxLevelIndexEntry> levelIndexEntry [2];
  string local_148;
  string local_120;
  CommandCompare *local_100;
  uint local_f8;
  uint local_f4;
  InputStreams *local_f0;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  PrintDiff *local_80;
  ulong local_78;
  pointer local_70;
  pointer local_68;
  pointer pcStack_60;
  undefined8 local_58;
  char *pcStack_50;
  pointer local_48 [3];
  
  local_100 = this;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Image Data\n\n","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&diff->context,
                    (diff->context).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&diff->context,
             &local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pKVar2 = (local_100->headers).super__Vector_base<KTX_header2,_std::allocator<KTX_header2>_>.
           _M_impl.super__Vector_impl_data._M_start;
  kVar1 = pKVar2->levelCount;
  uVar11 = pKVar2[1].levelCount;
  local_f8 = kVar1 + (kVar1 == 0);
  local_f4 = uVar11 + (uVar11 == 0);
  uVar4 = local_f8;
  if (local_f8 < uVar11) {
    uVar4 = local_f4;
  }
  local_70 = (pointer)(ulong)uVar4;
  pcVar13 = (pointer)0x0;
  local_f0 = streams;
  local_80 = diff;
  do {
    local_c8.field_2._M_local_buf[8] = '\0';
    local_a8.field_2._M_local_buf[8] = '\0';
    pbVar12 = &local_c8;
    iVar7 = 0;
    uVar11 = local_f8;
    bVar6 = true;
    do {
      bVar14 = bVar6;
      if (pcVar13 < (pointer)(ulong)uVar11) {
        local_58 = 0xf;
        pcStack_50 = "the level index";
        read(local_100,iVar7 * 0x3b8 + (int)streams,(void *)((long)pcVar13 * 0x18 + 0x50),
             (size_t)&local_120);
        (pbVar12->_M_dataplus)._M_p = local_120._M_dataplus._M_p;
        pbVar12->_M_string_length = local_120._M_string_length;
        (pbVar12->field_2)._M_allocated_capacity = local_120.field_2._M_allocated_capacity;
        if ((pbVar12->field_2)._M_local_buf[8] == '\0') {
          (pbVar12->field_2)._M_local_buf[8] = '\x01';
        }
      }
      sVar5 = local_c8._M_string_length;
      iVar7 = 1;
      pbVar12 = &local_a8;
      uVar11 = local_f4;
      bVar6 = false;
    } while (bVar14);
    if (((local_c8.field_2._M_local_buf[8] == '\0') || (local_a8.field_2._M_local_buf[8] != '\x01'))
       || (local_c8._M_string_length != local_a8._M_string_length)) {
LAB_001334ea:
      fmt_00.size_ = 2;
      fmt_00.data_ = (char *)0x19;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_148;
      local_148._M_dataplus._M_p = pcVar13;
      ::fmt::v10::vformat_abi_cxx11_(&local_e8,(v10 *)"Mismatch in level {} data",fmt_00,args_00);
      sVar5 = local_e8._M_string_length;
      _Var3._M_p = local_e8._M_dataplus._M_p;
      fmt_01.size_ = 2;
      fmt_01.data_ = (char *)0x4;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_48;
      local_48[0] = pcVar13;
      ::fmt::v10::vformat_abi_cxx11_(&local_148,(v10 *)"m={}",fmt_01,args_01);
      local_120._M_dataplus._M_p = (pointer)sVar5;
      local_120._M_string_length = (size_type)_Var3._M_p;
      local_120.field_2._M_allocated_capacity = local_148._M_string_length;
      local_120.field_2._8_8_ = local_148._M_dataplus._M_p;
      PrintDiff::operator<<(diff,(DiffMismatch *)&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pcVar8 = (pointer)operator_new__(local_c8._M_string_length);
      memset(pcVar8,0,sVar5);
      local_148._M_dataplus._M_p = pcVar8;
      pvVar9 = operator_new__(sVar5);
      local_78 = sVar5;
      memset(pvVar9,0,sVar5);
      local_148._M_string_length = (size_type)pvVar9;
      psVar10 = &local_148;
      pbVar12 = &local_c8;
      iVar7 = 0;
      bVar6 = true;
      do {
        bVar14 = bVar6;
        pcVar8 = (pbVar12->_M_dataplus)._M_p;
        _Var3._M_p = (psVar10->_M_dataplus)._M_p;
        fmt.size_ = 2;
        fmt.data_ = (char *)0xd;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_e8;
        local_e8._M_dataplus._M_p = pcVar13;
        ::fmt::v10::vformat_abi_cxx11_(&local_120,(v10 *)0x1fce00,fmt,args);
        local_68 = (pointer)local_120._M_string_length;
        pcStack_60 = local_120._M_dataplus._M_p;
        read(local_100,iVar7 * 0x3b8 + (int)local_f0,pcVar8,(size_t)_Var3._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        iVar7 = 1;
        psVar10 = (string *)&local_148._M_string_length;
        pbVar12 = &local_a8;
        bVar6 = false;
      } while (bVar14);
      iVar7 = bcmp(local_148._M_dataplus._M_p,(void *)local_148._M_string_length,local_78);
      diff = local_80;
      streams = local_f0;
      lVar15 = 8;
      do {
        pvVar9 = *(void **)((long)&local_148._M_dataplus._M_p + lVar15);
        if (pvVar9 != (void *)0x0) {
          operator_delete__(pvVar9);
        }
        *(undefined8 *)((long)&local_148._M_dataplus._M_p + lVar15) = 0;
        lVar15 = lVar15 + -8;
      } while (lVar15 != -8);
      if (iVar7 != 0) goto LAB_001334ea;
    }
    pcVar13 = pcVar13 + 1;
    if (pcVar13 == local_70) {
      return;
    }
  } while( true );
}

Assistant:

void CommandCompare::compareImagesRaw(PrintDiff& diff, InputStreams& streams) {
    diff.setContext("Image Data\n\n");

    const uint32_t numLevels[] = {
        std::max(1u, headers[0].levelCount),
        std::max(1u, headers[1].levelCount)
    };
    const uint32_t maxNumLevels = std::max(numLevels[0], numLevels[1]);

    for (uint32_t level = 0; level < maxNumLevels; ++level) {
        const auto levelIndexEntryOffset = sizeof(KTX_header2) + level * sizeof(ktxLevelIndexEntry);
        std::optional<ktxLevelIndexEntry> levelIndexEntry[2];
        for (std::size_t i = 0; i < streams.size(); ++i)
            if (level < numLevels[i]) {
                ktxLevelIndexEntry entry;
                read(streams[i], levelIndexEntryOffset, &entry, sizeof(entry), "the level index");
                levelIndexEntry[i] = entry;
            }

        bool mismatch = false;

        // Missing levels are always considered a mismatch
        if (!levelIndexEntry[0].has_value() || !levelIndexEntry[1].has_value())
            mismatch = true;

        // Mismatching level data sizes are always considered a mismatch
        if (!mismatch && levelIndexEntry[0]->byteLength != levelIndexEntry[1]->byteLength)
            mismatch = true;

        if (!mismatch) {
            // If so far so good then load the level data and compare them
            std::unique_ptr<uint8_t[]> buffers[] = {
                std::make_unique<uint8_t[]>(levelIndexEntry[0]->byteLength),
                std::make_unique<uint8_t[]>(levelIndexEntry[1]->byteLength)
            };

            for (std::size_t i = 0; i < streams.size(); ++i)
                read(streams[i], levelIndexEntry[i]->byteOffset, buffers[i].get(),
                    levelIndexEntry[i]->byteLength, fmt::format("level {} data", level));

            if (std::memcmp(buffers[0].get(), buffers[1].get(), levelIndexEntry[0]->byteLength) != 0)
                mismatch = true;
        }

        if (mismatch)
            diff << DiffMismatch(fmt::format("Mismatch in level {} data", level), fmt::format("m={}", level));
    }
}